

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O0

void __thiscall QString::clear(QString *this)

{
  long lVar1;
  bool bVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isNull((QString *)0x123fea);
  if (!bVar2) {
    QString((QString *)0x123ff8);
    operator=(in_RDI,in_stack_ffffffffffffffc8);
    ~QString((QString *)0x124011);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QString::clear()
{ if (!isNull()) *this = QString(); }